

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O0

difference_iterator<std::_Fwd_list_const_iterator<int>,_std::_Fwd_list_const_iterator<int>,_std::less<void>_>
* __thiscall
burst::
make_difference_iterator<std::forward_list<int,std::allocator<int>>const&,std::forward_list<int,std::allocator<int>>const&,void>
          (difference_iterator<std::_Fwd_list_const_iterator<int>,_std::_Fwd_list_const_iterator<int>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,forward_list<int,_std::allocator<int>_> *minuend,
          forward_list<int,_std::allocator<int>_> *subtrahend)

{
  const_iterator this_00;
  const_iterator minuend_begin;
  const_iterator minuend_end;
  const_iterator subtrahend_begin;
  _Fwd_list_const_iterator<int> in_R9;
  forward_list<int,_std::allocator<int>_> *subtrahend_local;
  forward_list<int,_std::allocator<int>_> *minuend_local;
  
  this_00 = std::begin<std::forward_list<int,std::allocator<int>>>
                      ((forward_list<int,_std::allocator<int>_> *)this);
  minuend_begin =
       std::end<std::forward_list<int,std::allocator<int>>>
                 ((forward_list<int,_std::allocator<int>_> *)this);
  minuend_end = std::begin<std::forward_list<int,std::allocator<int>>>(minuend);
  subtrahend_begin = std::end<std::forward_list<int,std::allocator<int>>>(minuend);
  make_difference_iterator<std::_Fwd_list_const_iterator<int>,std::_Fwd_list_const_iterator<int>>
            (__return_storage_ptr__,(burst *)this_00._M_node,
             (_Fwd_list_const_iterator<int>)minuend_begin._M_node,
             (_Fwd_list_const_iterator<int>)minuend_end._M_node,
             (_Fwd_list_const_iterator<int>)subtrahend_begin._M_node,in_R9);
  return __return_storage_ptr__;
}

Assistant:

auto make_difference_iterator (ForwardRange1 && minuend, ForwardRange2 && subtrahend)
    {
        using std::begin;
        using std::end;
        return
            make_difference_iterator
            (
                begin(std::forward<ForwardRange1>(minuend)),
                end(std::forward<ForwardRange1>(minuend)),
                begin(std::forward<ForwardRange2>(subtrahend)),
                end(std::forward<ForwardRange2>(subtrahend))
            );
    }